

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O0

HPDF_STATUS HPDF_Xref_WriteToStream(HPDF_Xref xref,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  ushort gen_no_00;
  HPDF_Xref p_Var1;
  HPDF_UINT32 object_id;
  char *eptr_00;
  void *pvVar2;
  char *pcVar3;
  HPDF_STATUS HVar4;
  HPDF_BYTE *s;
  HPDF_XrefEntry p_Var5;
  HPDF_XrefEntry entry_1;
  HPDF_UINT16 gen_no;
  HPDF_UINT obj_id;
  HPDF_XrefEntry entry;
  HPDF_Xref tmp_xref;
  HPDF_UINT str_idx;
  char *eptr;
  char *pbuf;
  char buf [32];
  HPDF_UINT i;
  HPDF_STATUS ret;
  HPDF_Encrypt e_local;
  HPDF_Stream_conflict stream_local;
  HPDF_Xref xref_local;
  
  eptr_00 = buf + 0x17;
  entry = (HPDF_XrefEntry)xref;
  do {
    p_Var1 = xref;
    if (entry == (HPDF_XrefEntry)0x0) {
      while( true ) {
        entry = (HPDF_XrefEntry)p_Var1;
        if (entry == (HPDF_XrefEntry)0x0) {
          HVar4 = WriteTrailer(xref,stream);
          return HVar4;
        }
        *(HPDF_UINT *)&entry[1].gen_no = stream->size;
        s = HPDF_StrCpy((char *)&pbuf,"xref\n",eptr_00);
        pcVar3 = HPDF_IToA((char *)s,*(HPDF_INT32 *)&entry->obj,eptr_00);
        *pcVar3 = ' ';
        pcVar3 = HPDF_IToA(pcVar3 + 1,*(HPDF_INT32 *)(*(long *)(entry + 1) + 0x18),eptr_00);
        HPDF_StrCpy(pcVar3,"\n",eptr_00);
        HVar4 = HPDF_Stream_WriteStr(stream,(char *)&pbuf);
        if (HVar4 != 0) break;
        buf[0x1c] = '\0';
        buf[0x1d] = '\0';
        buf[0x1e] = '\0';
        buf[0x1f] = '\0';
        for (; (uint)buf._28_4_ < *(uint *)(*(long *)(entry + 1) + 0x18);
            buf._28_4_ = buf._28_4_ + 1) {
          p_Var5 = HPDF_Xref_GetEntry((HPDF_Xref)entry,buf._28_4_);
          pcVar3 = HPDF_IToA2((char *)&pbuf,p_Var5->byte_offset,0xb);
          *pcVar3 = ' ';
          pcVar3 = HPDF_IToA2(pcVar3 + 1,(uint)p_Var5->gen_no,6);
          *pcVar3 = ' ';
          pcVar3[1] = p_Var5->entry_typ;
          HPDF_StrCpy(pcVar3 + 2,"\r\n",eptr_00);
          HVar4 = HPDF_Stream_WriteStr(stream,(char *)&pbuf);
          if (HVar4 != 0) {
            return HVar4;
          }
        }
        p_Var1 = (HPDF_Xref)entry[1].obj;
      }
      return HVar4;
    }
    tmp_xref._4_4_ = (uint)(*(int *)&entry->obj == 0);
    buf[0x1c] = tmp_xref._4_1_;
    buf[0x1d] = tmp_xref._5_1_;
    buf[0x1e] = tmp_xref._6_1_;
    buf[0x1f] = tmp_xref._7_1_;
    for (; (uint)buf._28_4_ < *(uint *)(*(long *)(entry + 1) + 0x18); buf._28_4_ = buf._28_4_ + 1) {
      pvVar2 = HPDF_List_ItemAt(*(HPDF_List *)(entry + 1),buf._28_4_);
      object_id = *(int *)&entry->obj + buf._28_4_;
      gen_no_00 = *(ushort *)((long)pvVar2 + 8);
      *(HPDF_UINT *)((long)pvVar2 + 4) = stream->size;
      pcVar3 = HPDF_IToA((char *)&pbuf,object_id,eptr_00);
      *pcVar3 = ' ';
      pcVar3 = HPDF_IToA(pcVar3 + 1,(uint)gen_no_00,eptr_00);
      HPDF_StrCpy(pcVar3," obj\n",eptr_00);
      HVar4 = HPDF_Stream_WriteStr(stream,(char *)&pbuf);
      if (HVar4 != 0) {
        return HVar4;
      }
      if (e != (HPDF_Encrypt)0x0) {
        HPDF_Encrypt_InitKey(e,object_id,gen_no_00);
      }
      HVar4 = HPDF_Obj_WriteValue(*(void **)((long)pvVar2 + 0x10),stream,e);
      if (HVar4 != 0) {
        return HVar4;
      }
      HVar4 = HPDF_Stream_WriteStr(stream,"\nendobj\n");
      if (HVar4 != 0) {
        return HVar4;
      }
    }
    entry = (HPDF_XrefEntry)entry[1].obj;
  } while( true );
}

Assistant:

HPDF_STATUS
HPDF_Xref_WriteToStream  (HPDF_Xref    xref,
                          HPDF_Stream  stream,
                          HPDF_Encrypt e)
{
    HPDF_STATUS ret;
    HPDF_UINT i;
    char buf[HPDF_SHORT_BUF_SIZ];
    char* pbuf;
    char* eptr = buf + HPDF_SHORT_BUF_SIZ - 1;
    HPDF_UINT str_idx;
    HPDF_Xref tmp_xref = xref;

    /* write each objects of xref to the specified stream */

    HPDF_PTRACE((" HPDF_Xref_WriteToStream\n"));

    while (tmp_xref) {
        if (tmp_xref->start_offset == 0)
            str_idx = 1;
        else
            str_idx = 0;

        for (i = str_idx; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry  entry =
                        (HPDF_XrefEntry)HPDF_List_ItemAt (tmp_xref->entries, i);
            HPDF_UINT obj_id = tmp_xref->start_offset + i;
            HPDF_UINT16 gen_no = entry->gen_no;

            entry->byte_offset = stream->size;

            pbuf = buf;
            pbuf = HPDF_IToA (pbuf, obj_id, eptr);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA (pbuf, gen_no, eptr);
            HPDF_StrCpy(pbuf, " obj\012", eptr);

            if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
               return ret;

            if (e)
                HPDF_Encrypt_InitKey (e, obj_id, gen_no);

            if ((ret = HPDF_Obj_WriteValue (entry->obj, stream, e)) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteStr (stream, "\012endobj\012"))
                    != HPDF_OK)
                return ret;
       }

       tmp_xref = tmp_xref->prev;
    }

    /* start to write cross-reference table */

    tmp_xref = xref;

    while (tmp_xref) {
        tmp_xref->addr = stream->size;

        pbuf = buf;
        pbuf = (char *)HPDF_StrCpy (pbuf, "xref\012", eptr);
        pbuf = HPDF_IToA (pbuf, tmp_xref->start_offset, eptr);
        *pbuf++ = ' ';
        pbuf = HPDF_IToA (pbuf, tmp_xref->entries->count, eptr);
        HPDF_StrCpy (pbuf, "\012", eptr);
        ret = HPDF_Stream_WriteStr (stream, buf);
        if (ret != HPDF_OK)
            return ret;

        for (i = 0; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

            pbuf = buf;
            pbuf = HPDF_IToA2 (pbuf, entry->byte_offset, HPDF_BYTE_OFFSET_LEN +
                    1);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA2 (pbuf, entry->gen_no, HPDF_GEN_NO_LEN + 1);
            *pbuf++ = ' ';
            *pbuf++ = entry->entry_typ;
            HPDF_StrCpy (pbuf, "\015\012", eptr); /* Acrobat 8.15 requires both \r and \n here */
            ret = HPDF_Stream_WriteStr (stream, buf);
            if (ret != HPDF_OK)
                return ret;
        }

        tmp_xref = tmp_xref->prev;
    }

    /* write trailer dictionary */
    ret = WriteTrailer (xref, stream);

    return ret;
}